

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

void StringFormatter<std::__cxx11::string_const&,char_const*>::
     format<std::__cxx11::string_const,char_const*const&>
               (ostream *os,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,char **args)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  runtime_error *this;
  bool local_ca;
  bool local_b2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  byte local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char local_56;
  byte local_55;
  int local_54;
  char type;
  bool haveprecision;
  int precision;
  bool havewidth;
  char *pcStack_48;
  int width;
  char *q;
  char padchar;
  bool forcesign;
  char *pcStack_38;
  bool leftadjust;
  char *p;
  char **ppcStack_28;
  bool used_value;
  char **args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  char *fmt_local;
  ostream *os_local;
  
  p._7_1_ = 0;
  pcStack_38 = fmt;
  ppcStack_28 = args;
  args_local = (char **)value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt;
  fmt_local = (char *)os;
  while( true ) {
    while( true ) {
      if (*pcStack_38 == '\0') {
        if ((p._7_1_ & 1) != 0) {
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*pcStack_38 == '%') break;
      cVar1 = *pcStack_38;
      pcStack_38 = pcStack_38 + 1;
      std::operator<<((ostream *)fmt_local,cVar1);
    }
    pcVar3 = pcStack_38 + 1;
    if (*pcVar3 != '%') break;
    pcStack_38 = pcStack_38 + 2;
    std::operator<<((ostream *)fmt_local,*pcVar3);
  }
  q._7_1_ = *pcVar3 == '-';
  if ((bool)q._7_1_) {
    pcVar3 = pcStack_38 + 2;
  }
  pcStack_38 = pcVar3;
  q._6_1_ = 0;
  if (*pcStack_38 == '+') {
    pcStack_38 = pcStack_38 + 1;
    q._6_1_ = 1;
  }
  else if (*pcStack_38 == ' ') {
    pcStack_38 = pcStack_38 + 1;
  }
  q._5_1_ = 0x20;
  if (*pcStack_38 == '0') {
    pcStack_38 = pcStack_38 + 1;
    q._5_1_ = 0x30;
  }
  else if (*pcStack_38 == ',') {
    pcStack_38 = pcStack_38 + 1;
    q._5_1_ = 0x2c;
  }
  lVar4 = strtol(pcStack_38,&stack0xffffffffffffffb8,10);
  precision = (int)lVar4;
  haveprecision = pcStack_38 != pcStack_48;
  pcStack_38 = pcStack_48;
  local_54 = 0;
  local_55 = 0;
  if (*pcStack_48 == '.') {
    pcStack_38 = pcStack_48 + 1;
    lVar4 = strtol(pcStack_38,&stack0xffffffffffffffb8,10);
    local_54 = (int)lVar4;
    local_55 = pcStack_38 != pcStack_48;
    pcStack_38 = pcStack_48;
  }
  while (pcVar3 = strchr("qhlLzjt",(int)*pcStack_38), pcVar3 != (char *)0x0) {
    pcStack_38 = pcStack_38 + 1;
  }
  pcVar3 = pcStack_38;
  if ((*pcStack_38 == 'I') &&
     ((pcStack_38[2] == '6' || (pcVar3 = pcStack_38 + 1, pcStack_38[2] == '4')))) {
    pcVar3 = pcStack_38 + 3;
  }
  pcStack_38 = pcVar3;
  local_56 = '\0';
  if (*pcStack_38 != '\0') {
    local_56 = *pcStack_38;
    pcStack_38 = pcStack_38 + 1;
  }
  StringFormatter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*>
  ::applytype((ostream *)fmt_local,local_56);
  if ((q._6_1_ & 1) == 0) {
    std::ostream::operator<<(fmt_local,std::noshowpos);
  }
  else {
    std::ostream::operator<<(fmt_local,std::showpos);
  }
  if ((q._7_1_ & 1) == 0) {
    if ((q._6_1_ & 1) != 0) {
      std::ostream::operator<<(fmt_local,std::internal);
    }
  }
  else {
    std::ostream::operator<<(fmt_local,std::left);
  }
  if ((haveprecision & 1U) == 0) {
    std::ios_base::width((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  }
  else {
    std::ios_base::width
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)precision);
    if (((q._7_1_ & 1) == 0) && ((q._6_1_ & 1) == 0)) {
      std::ostream::operator<<(fmt_local,std::right);
    }
  }
  if ((local_55 & 1) != 0) {
    std::ios_base::precision
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)local_54);
  }
  std::ios::fill((char)fmt_local + (char)*(undefined8 *)(*(long *)fmt_local + -0x18));
  if ((((local_56 != 'c') ||
       (bVar2 = output_wchar<std::__cxx11::string>
                          ((ostream *)fmt_local,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_local), !bVar2)) &&
      ((local_56 != 'p' ||
       (bVar2 = output_pointer<std::__cxx11::string>
                          ((ostream *)fmt_local,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_local), !bVar2)))) &&
     ((local_56 != 'b' ||
      (bVar2 = output_hex_data<std::__cxx11::string>
                         ((ostream *)fmt_local,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          args_local), !bVar2)))) {
    pcVar5 = strchr("iduoxX",(int)local_56);
    pcVar3 = fmt_local;
    local_79 = 0;
    local_b2 = false;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local);
      local_79 = 1;
      local_b2 = output_int<std::__cxx11::string>((ostream *)pcVar3,&local_78);
    }
    if ((local_79 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    pcVar3 = fmt_local;
    if (local_b2 == false) {
      local_ca = false;
      if (local_56 == 's') {
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local);
        local_ca = output_null<std::__cxx11::string>((ostream *)pcVar3,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      if ((local_ca == false) &&
         (bVar2 = output_using_operator<std::__cxx11::string>
                            ((ostream *)fmt_local,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_local), !bVar2)) {
        std::operator<<((ostream *)fmt_local,"<?>");
      }
    }
  }
  std::ios_base::precision((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  p._7_1_ = 1;
  format<char_const*const>((ostream *)fmt_local,pcStack_38,ppcStack_28);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }